

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O3

CURLcode Curl_hsts_loadcb(Curl_easy *data,hsts *h)

{
  curl_hstsread_callback p_Var1;
  ushort uVar2;
  CURLSTScode CVar3;
  CURLcode CVar4;
  time_t expires;
  CURLcode CVar5;
  bool bVar6;
  char buffer [257];
  curl_hstsentry local_160;
  char local_138 [264];
  
  CVar5 = CURLE_OK;
  CVar4 = CVar5;
  if ((h != (hsts *)0x0) && (p_Var1 = (data->set).hsts_read, p_Var1 != (curl_hstsread_callback)0x0))
  {
    local_160.namelen = 0x100;
    local_160._16_2_ = 0;
    local_138[0] = '\0';
    local_160.name = local_138;
    CVar3 = (*p_Var1)(data,&local_160,(data->set).hsts_read_userp);
    uVar2 = local_160._16_2_;
    while (CVar3 == CURLSTS_OK) {
      if (*local_160.name == '\0') {
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      local_160.expire[0] = (char)(uVar2 >> 8);
      bVar6 = local_160.expire[0] != '\0';
      expires = 0x7fffffffffffffff;
      local_160._16_2_ = uVar2;
      if (bVar6) {
        expires = Curl_getdate_capped(local_160.expire);
      }
      CVar4 = hsts_create(h,local_160.name,(_Bool)(local_160._16_1_ & 1),expires);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      local_160.namelen = 0x100;
      local_160.expire[0] = '\0';
      local_160._16_1_ = local_160._16_1_ & 0xfe;
      local_138[0] = '\0';
      local_160.name = local_138;
      CVar3 = (*(data->set).hsts_read)(data,&local_160,(data->set).hsts_read_userp);
      uVar2 = local_160._16_2_;
    }
    CVar4 = CURLE_ABORTED_BY_CALLBACK;
    if (CVar3 != CURLSTS_FAIL) {
      CVar4 = CVar5;
    }
  }
  return CVar4;
}

Assistant:

CURLcode Curl_hsts_loadcb(struct Curl_easy *data, struct hsts *h)
{
  if(h)
    return hsts_pull(data, h);
  return CURLE_OK;
}